

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dvrktest.cpp
# Opt level: O1

Result TestPowerAmplifier(AmpIO **Board,BasePort *Port)

{
  uint32_t uVar1;
  int iVar2;
  Result RVar3;
  int *piVar4;
  ostream *poVar5;
  bool bVar6;
  uint index;
  char *pcVar7;
  long lVar8;
  double dVar9;
  int local_88;
  Result local_84;
  timespec local_78;
  char *local_68;
  undefined8 uStack_60;
  AmpIO **local_50;
  BasePort *local_48;
  ulong local_40;
  char *local_38;
  
  bVar6 = 0 < NUM_FPGA;
  if (NUM_FPGA < 1) {
    local_84 = pass;
    local_88 = 0;
  }
  else {
    lVar8 = 0;
    local_88 = 0;
    local_84 = pass;
    local_50 = Board;
    local_48 = Port;
    do {
      if (0 < NUM_CHANNEL_PER_FPGA) {
        index = 0;
        do {
          if ((lVar8 == 1 && index == 3) || (lVar8 == 0 && index == 7)) break;
          (*Port->_vptr_BasePort[0x1d])(Port);
          uVar1 = AmpIO::GetAnalogInput(*Board,0);
          if (ABS((double)(long)((ulong)uVar1 - 0x2000)) < 1280.0) {
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,COLOR_ERROR_abi_cxx11_._M_dataplus._M_p,
                                COLOR_ERROR_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"(unexpected current detected on channel 0)",0x2a);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,COLOR_OFF_abi_cxx11_._M_dataplus._M_p,
                                COLOR_OFF_abi_cxx11_._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&logfile,"unexpected current detected on channel 0",0x28);
            std::ios::widen((char)*(undefined8 *)(logfile + -0x18) + 'x');
            std::ostream::put('x');
            std::ostream::flush();
            goto LAB_00107be1;
          }
          AmpIO::SetMotorCurrent(Board[lVar8],index,0x8500);
          (*Port->_vptr_BasePort[0x21])(Port);
          local_78.tv_sec = 0;
          local_78.tv_nsec = 200000000;
          do {
            iVar2 = nanosleep(&local_78,&local_78);
            if (iVar2 != -1) break;
            piVar4 = __errno_location();
          } while (*piVar4 == 4);
          (*Port->_vptr_BasePort[0x1d])(Port);
          uVar1 = AmpIO::GetMotorCurrent(Board[lVar8],index);
          local_40 = (ulong)uVar1;
          local_68 = (char *)ABS((double)(long)(local_40 - 0x8500));
          uStack_60 = 0;
          uVar1 = AmpIO::GetAnalogInput(*Board,0);
          dVar9 = ABS((double)(long)((ulong)uVar1 - 0x2000));
          iVar2 = (int)lVar8;
          local_38 = " ... \x1b[0;32m[PASS]\x1b[0m";
          if (512.0 <= (double)local_68) {
            local_38 = " ... \x1b[1;91m[FAIL]\x1b[0m";
          }
          pcVar7 = "... PASS";
          if (512.0 <= (double)local_68) {
            pcVar7 = "... FAIL";
            local_84 = fail;
          }
          *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
               *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8
          ;
          local_88 = (uint)(((index == 4 && lVar8 == 0) && (double)local_68 < 512.0) &&
                           dVar9 < 1280.0) +
                     local_88 +
                     (uint)(((index == 0 && lVar8 == 1) && (double)local_68 < 512.0) &&
                           dVar9 < 1280.0) +
                     (uint)(((double)local_68 < 512.0 && (index == 0 && iVar2 == 0)) &&
                           1280.0 <= dVar9);
          local_68 = pcVar7;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"board ",6);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," amp channel ",0xd);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,index);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," - ",3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," expected=",10);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," measured=",10);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          *(uint *)(&DAT_00128490 + *(long *)(logfile + -0x18)) =
               *(uint *)(&DAT_00128490 + *(long *)(logfile + -0x18)) & 0xffffffb5 | 8;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&logfile,"board ",6);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&logfile,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," amp channel ",0xd);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,index);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," - ",3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," expected=",10);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," measured=",10);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          Port = local_48;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_38,0x16);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
          std::ostream::put('\x18');
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&logfile,local_68,8);
          std::ios::widen((char)*(undefined8 *)(logfile + -0x18) + 'x');
          Board = local_50;
          std::ostream::put('x');
          std::ostream::flush();
          AmpIO::SetMotorCurrent(Board[lVar8],index,0x8000);
          (*Port->_vptr_BasePort[0x21])(Port);
          local_78.tv_sec = 0;
          local_78.tv_nsec = 200000000;
          do {
            iVar2 = nanosleep(&local_78,&local_78);
            if (iVar2 != -1) break;
            piVar4 = __errno_location();
          } while (*piVar4 == 4);
          index = index + 1;
        } while ((int)index < NUM_CHANNEL_PER_FPGA);
      }
      lVar8 = lVar8 + 1;
      bVar6 = lVar8 < NUM_FPGA;
    } while (lVar8 < NUM_FPGA);
  }
LAB_00107be1:
  RVar3 = fatal_fail;
  if (!bVar6) {
    if (local_88 == 2) {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,COLOR_ERROR_abi_cxx11_._M_dataplus._M_p,
                          COLOR_ERROR_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"(DB9 cables are likely crossed!)",0x20);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,COLOR_OFF_abi_cxx11_._M_dataplus._M_p,
                          COLOR_OFF_abi_cxx11_._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&logfile,"DB9 cables are likely crossed!",0x1e);
      std::ios::widen((char)*(undefined8 *)(logfile + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      local_84 = fatal_fail;
    }
    RVar3 = local_84;
    if (local_84 == fail) {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,COLOR_ERROR_abi_cxx11_._M_dataplus._M_p,
                          COLOR_ERROR_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"(Are the DB9 cables plugged in?)",0x20);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,COLOR_OFF_abi_cxx11_._M_dataplus._M_p,
                          COLOR_OFF_abi_cxx11_._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
  }
  return RVar3;
}

Assistant:

Result TestPowerAmplifier(AmpIO **Board, BasePort *Port) {
    int crossed_db9_error_count = 0;
    Result result = pass;

    for (int board_index = 0; board_index < NUM_FPGA; board_index++) {
        for (int channel_index = 0; channel_index < NUM_CHANNEL_PER_FPGA; channel_index++) {
            if (board_index == 1 && channel_index == 3) break;
            if (board_index == 0 && channel_index == 7) break;

            Port->ReadAllBoards();

            if (std::fabs((long) Board[0]->GetAnalogInput(0) - (long) POT_TEST_ADC_COUNT[0] / 2) <
                POT_TEST_ADC_ERROR_TOLERANCE) {
                std::cout << COLOR_ERROR << "(unexpected current detected on channel 0)" << COLOR_OFF << std::endl;
                logfile << "unexpected current detected on channel 0" << std::endl;
                return fatal_fail;
            }

            Board[board_index]->SetMotorCurrent(channel_index, POWER_AMP_TEST_DAC);
            Port->WriteAllBoards();
            std::this_thread::sleep_for(std::chrono::milliseconds(200));

            Port->ReadAllBoards();
            auto motor_current = Board[board_index]->GetMotorCurrent(channel_index);
            bool amp_working = std::fabs((long) motor_current - (long) POWER_AMP_TEST_DAC) <
                               POWER_AMP_TEST_TOLERANCE;
            bool channel_0_load_driven =
                    std::fabs((long) Board[0]->GetAnalogInput(0) - (long) POT_TEST_ADC_COUNT[0] / 2) <
                    POT_TEST_ADC_ERROR_TOLERANCE;

            if (board_index == 0 && channel_index == 0 && amp_working && !channel_0_load_driven) {
                crossed_db9_error_count++;
            }

            if (board_index == 1 && channel_index == 0 && amp_working && channel_0_load_driven) {
                crossed_db9_error_count++;
            }

            if (board_index == 0 && channel_index == 4 && amp_working && channel_0_load_driven) {
                crossed_db9_error_count++;
            }

            std::cout << std::hex << "board " << board_index << " amp channel " << channel_index << " - "
                      << " expected="
                      << POWER_AMP_TEST_DAC << " measured=" << motor_current;
            logfile << std::hex << "board " << board_index << " amp channel " << channel_index << " - "
                        << " expected="
                        << POWER_AMP_TEST_DAC << " measured=" << motor_current;

            if (!amp_working) {
                result = fail;
                std::cout << FAIL << std::endl;
                logfile << "... FAIL" << std::endl;
            } else {
                std::cout << PASS << std::endl;
                logfile << "... PASS" << std::endl;
            }

            Board[board_index]->SetMotorCurrent(channel_index, 0x8000);
            Port->WriteAllBoards();
            std::this_thread::sleep_for(std::chrono::milliseconds(200));


        }
    }
    if (crossed_db9_error_count == 2) {
        result = fatal_fail;
        std::cout << COLOR_ERROR << "(DB9 cables are likely crossed!)" << COLOR_OFF << std::endl;
        logfile << "DB9 cables are likely crossed!" << std::endl;
    }

    if (result == fail) {
        std::cout << COLOR_ERROR << "(Are the DB9 cables plugged in?)" << COLOR_OFF << std::endl;
    }

    return result;

}